

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O1

void fill_nh_score_entry(toptenentry *in,nh_topten_entry *out,int rank,boolean highlight)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *s;
  
  iVar3 = str2role(in->plrole);
  iVar4 = str2race(in->plrace);
  pcVar9 = in->plgend;
  iVar5 = str2gend(pcVar9);
  iVar6 = str2align(in->plalign);
  if ((iVar6 == -1 || iVar5 == -1) || (iVar4 == -1 || iVar3 == -1)) {
    return;
  }
  out->rank = rank;
  out->points = in->points;
  out->maxlvl = in->maxlvl;
  out->hp = in->hp;
  out->maxhp = in->maxhp;
  out->deaths = in->deaths;
  out->ver_major = in->ver_major;
  out->ver_minor = in->ver_minor;
  out->patchlevel = in->patchlevel;
  out->highlight = highlight;
  out->moves = in->moves;
  out->end_how = in->how;
  strncpy(out->name,in->name,0xf);
  pcVar10 = in->death;
  strncpy(out->death,pcVar10,99);
  if ((iVar5 != 1) || (pcVar7 = roles[iVar3].name.f, pcVar7 == (char *)0x0)) {
    pcVar7 = roles[iVar3].name.m;
  }
  strncpy(out->plrole,pcVar7,0x10);
  strncpy(out->plrace,races[iVar4].noun,0x10);
  strncpy(out->plgend,genders[iVar5].adj,0x10);
  strncpy(out->plalign,aligns[iVar6].adj,0x10);
  out->entrytxt[0] = '\0';
  s = out->entrytxt;
  pcVar7 = eos(s);
  sprintf(pcVar7,"%.16s %s-%s-%s-%s ",in->name,in->plrole,in->plrace,pcVar9,in->plalign);
  iVar3 = strncmp("defied",pcVar10,6);
  if (iVar3 == 0) {
    pcVar7 = eos(s);
    iVar3 = strncmp(" (",in->death + 7,2);
    pcVar10 = "";
    if (iVar3 == 0) {
      pcVar10 = in->death + 9;
    }
    pcVar9 = "defied the Gods and escaped the dungeon %s";
    goto LAB_002601bf;
  }
  iVar3 = strncmp("escaped",pcVar10,7);
  if (iVar3 == 0) {
    pcVar10 = eos(s);
    iVar3 = strncmp(" (",in->death + 7,2);
    pcVar9 = "";
    if (iVar3 == 0) {
      pcVar9 = in->death + 9;
    }
    bVar1 = false;
    sprintf(pcVar10,"escaped the dungeon %s[max level %d]",pcVar9,(ulong)(uint)in->maxlvl);
    pcVar9 = strchr(s,0x29);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = (in->deathdnum != (int)dungeon_topology.d_astral_level.dnum) << 5;
      bVar1 = false;
    }
    goto LAB_002601c6;
  }
  iVar3 = strncmp("ascended ",pcVar10,9);
  if (iVar3 == 0) {
    sVar8 = strlen(s);
    builtin_strncpy(s + sVar8,"the ",5);
    strcat(s,in->death + 9);
    pcVar7 = eos(s);
    pcVar10 = "";
    if (in->plgend[0] == 'F') {
      pcVar10 = "dess";
    }
    pcVar9 = " ascended to demigod%s-hood";
  }
  else {
    iVar3 = strncmp("ascended",pcVar10,8);
    if (iVar3 != 0) {
      iVar3 = strncmp(pcVar10,"quit",4);
      if (iVar3 == 0) {
        sVar8 = strlen(s);
        builtin_strncpy(s + sVar8,"quit",5);
LAB_00260258:
        bVar1 = false;
      }
      else {
        iVar3 = strncmp(pcVar10,"died of st",10);
        if (iVar3 == 0) {
          sVar8 = strlen(s);
          builtin_strncpy(s + sVar8,"starved to death",0x11);
          goto LAB_00260258;
        }
        iVar3 = strncmp(pcVar10,"choked",6);
        if (iVar3 == 0) {
          pcVar7 = eos(s);
          pcVar11 = "is";
          if (*pcVar9 == 'F') {
            pcVar11 = "er";
          }
          sprintf(pcVar7,"choked on h%s food",pcVar11);
        }
        else {
          iVar3 = strncmp(pcVar10,"poisoned",8);
          if (iVar3 == 0) {
            sVar8 = strlen(s);
            builtin_strncpy(s + sVar8,"was poisoned",0xd);
          }
          else {
            iVar3 = strncmp(pcVar10,"crushed",7);
            if (iVar3 == 0) {
              sVar8 = strlen(s);
              builtin_strncpy(s + sVar8,"was crushed to death",0x15);
            }
            else {
              iVar3 = strncmp(pcVar10,"petrified by ",0xd);
              sVar8 = strlen(s);
              if (iVar3 == 0) {
                builtin_strncpy(s + sVar8,"turned to stone",0x10);
              }
              else {
                builtin_strncpy(s + sVar8,"died",5);
              }
            }
          }
        }
        bVar1 = true;
      }
      sVar8 = strlen(s);
      (s + sVar8)[0] = ' ';
      (s + sVar8)[1] = '\0';
      topten_level_name(in->deathdnum,in->deathlev,s);
      if (in->deathlev != in->maxlvl) {
        pcVar9 = eos(s);
        sprintf(pcVar9," [max %d]",(ulong)(uint)in->maxlvl);
      }
      iVar3 = strncmp(pcVar10,"quit ",5);
      if (iVar3 == 0) {
        strcat(s,in->death + 4);
      }
      goto LAB_002601c6;
    }
    pcVar7 = eos(s);
    pcVar10 = "";
    if (*pcVar9 == 'F') {
      pcVar10 = "dess";
    }
    pcVar9 = "ascended to demigod%s-hood";
  }
LAB_002601bf:
  bVar1 = false;
  sprintf(pcVar7,pcVar9,pcVar10);
LAB_002601c6:
  sVar8 = strlen(s);
  (s + sVar8)[0] = '.';
  (s + sVar8)[1] = '\0';
  if (!bVar1) {
    return;
  }
  pcVar9 = eos(s);
  cVar2 = highc(in->death[0]);
  sprintf(pcVar9,"  %c%s.",(ulong)(uint)(int)cVar2,in->death + 1);
  return;
}

Assistant:

static void fill_nh_score_entry(struct toptenentry *in, struct nh_topten_entry *out,
				int rank, boolean highlight)
{
    
    int rolenum = str2role(in->plrole);
    int racenum = str2race(in->plrace);
    int gendnum = str2gend(in->plgend);
    int alignnum = str2align(in->plalign);
    
    if (rolenum == ROLE_NONE || racenum == ROLE_NONE ||
	gendnum == ROLE_NONE || alignnum == ROLE_NONE)
	return;
    
    out->rank = rank;
    out->points = in->points;
    out->maxlvl = in->maxlvl;
    out->hp = in->hp;
    out->maxhp = in->maxhp;
    out->deaths = in->deaths;
    out->ver_major = in->ver_major;
    out->ver_minor = in->ver_minor;
    out->patchlevel = in->patchlevel;
    out->highlight = highlight;
    out->moves = in->moves;
    out->end_how = in->how;
    
    strncpy(out->name, in->name, NAMSZ);
    strncpy(out->death, in->death, DTHSZ);
    
    if (gendnum == 1 && roles[rolenum].name.f)
	strncpy(out->plrole, roles[rolenum].name.f, PLRBUFSZ);
    else
	strncpy(out->plrole, roles[rolenum].name.m, PLRBUFSZ);
    
    strncpy(out->plrace, races[racenum].noun, PLRBUFSZ);
    strncpy(out->plgend, genders[gendnum].adj, PLRBUFSZ);
    strncpy(out->plalign, aligns[alignnum].adj, PLRBUFSZ);
    
    topten_death_description(in, out->entrytxt);
}